

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  int iVar1;
  Type TVar2;
  Exception *other_local;
  Exception *this_local;
  
  String::String(&this->ownFile,&other->ownFile);
  iVar1 = other->line;
  TVar2 = other->type;
  this->file = other->file;
  this->line = iVar1;
  this->type = TVar2;
  String::String(&this->description,&other->description);
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe(&this->context,&other->context);
  String::String(&this->remoteTrace,&other->remoteTrace);
  memcpy(this->trace,other->trace,0x105);
  Vector<kj::Exception::Detail>::Vector(&this->details,&other->details);
  return;
}

Assistant:

Exception(Exception&& other) = default;